

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gb_Cpu.cpp
# Opt level: O0

bool __thiscall Gb_Cpu::run(Gb_Cpu *this,blargg_long cycle_count)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  undefined4 uVar5;
  ushort uVar6;
  ushort uVar7;
  byte bVar8;
  undefined1 uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  byte *pbVar14;
  ulong uVar15;
  byte *p;
  int in_ESI;
  Gbs_Emu *in_RDI;
  int offset_4;
  int offset_3;
  int offset_2;
  int bit_1;
  int temp;
  int bit;
  uint addr_1;
  uint addr;
  int offset_1;
  int offset;
  uint data;
  uint op;
  uint8_t *instr;
  uint flags;
  uint sp;
  uint pc;
  core_regs_t rg;
  state_t s;
  uint in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  int in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  uint local_b8;
  uint local_b0;
  uint local_9c;
  uint local_94;
  uint local_88;
  uint local_84;
  uint local_74;
  uint local_70;
  uint local_6c;
  undefined8 local_68;
  long local_60 [9];
  int local_18;
  
  *(uint *)&(in_RDI->super_Classic_Emu).super_Music_Emu.super_Gme_File.playlist.info_.ripping =
       in_ESI + 4U >> 2;
  (in_RDI->super_Classic_Emu).super_Music_Emu.super_Gme_File.user_data_ = local_60;
  memcpy(local_60,&(in_RDI->super_Classic_Emu).super_Music_Emu.super_Gme_File.user_cleanup_,0x50);
  local_68 = (in_RDI->super_Classic_Emu).super_Music_Emu.super_Gme_File._vptr_Gme_File;
  local_70 = (uint)(ushort)(in_RDI->super_Classic_Emu).super_Music_Emu.super_Gme_File.track_count_;
  local_74 = (uint)*(byte *)((long)&(in_RDI->super_Classic_Emu).super_Music_Emu.super_Gme_File.
                                    _vptr_Gme_File + 7);
  local_6c = (uint)(in_RDI->super_Classic_Emu).super_Music_Emu.super_Gme_File.type_;
LAB_0097842d:
  iVar11 = local_18;
  pbVar14 = (byte *)(local_60[local_6c >> 0xd] + (ulong)(local_6c & 0x1fff));
  p = pbVar14 + 1;
  bVar1 = *pbVar14;
  uVar13 = (uint)bVar1;
  uVar10 = local_6c + 1;
  local_18 = local_18 + -1;
  if (local_18 == 0) {
switchD_009784ce_default:
    (in_RDI->super_Classic_Emu).super_Music_Emu.super_Gme_File._vptr_Gme_File = local_68;
    (in_RDI->super_Classic_Emu).super_Music_Emu.super_Gme_File.type_ = (gme_type_t)(ulong)local_6c;
    *(short *)&(in_RDI->super_Classic_Emu).super_Music_Emu.super_Gme_File.track_count_ =
         (short)local_70;
    *(char *)((long)&(in_RDI->super_Classic_Emu).super_Music_Emu.super_Gme_File._vptr_Gme_File + 7)
         = (char)local_74;
    (in_RDI->super_Classic_Emu).super_Music_Emu.super_Gme_File.user_data_ =
         &(in_RDI->super_Classic_Emu).super_Music_Emu.super_Gme_File.user_cleanup_;
    memcpy(&(in_RDI->super_Classic_Emu).super_Music_Emu.super_Gme_File.user_cleanup_,local_60,0x50);
    return 0 < local_18;
  }
  bVar2 = *p;
  local_88 = (uint)bVar2;
  uVar15 = (ulong)uVar13;
  bVar3 = (byte)local_68;
  bVar8 = local_68._6_1_;
  uVar9 = local_68._7_1_;
  uVar4 = (ushort)local_68;
  uVar6 = local_68._2_2_;
  uVar7 = local_68._4_2_;
  uVar5 = (undefined4)local_68;
  switch(uVar15) {
  case 0:
  case 0x40:
  case 0x49:
  case 0x52:
  case 0x5b:
  case 100:
  case 0x6d:
  case 0x7f:
    local_6c = uVar10;
    goto LAB_0097842d;
  case 1:
  case 0x11:
    uVar10 = get_le16(p);
    *(short *)((long)local_60 + (ulong)(bVar1 >> 4) * 2 + -8) = (short)uVar10;
    local_6c = local_6c + 3;
    goto LAB_0097842d;
  case 2:
    local_6c = uVar10;
    break;
  case 3:
  case 0x13:
  case 0x23:
    *(short *)((long)local_60 + (ulong)(bVar1 >> 4) * 2 + -8) =
         *(short *)((long)local_60 + (ulong)(bVar1 >> 4) * 2 + -8) + 1;
    local_6c = uVar10;
    goto LAB_0097842d;
  case 4:
  case 0xc:
  case 0x14:
  case 0x1c:
  case 0x24:
  case 0x2c:
  case 0x3c:
    uVar13 = bVar1 >> 3 & 7;
    local_88 = *(byte *)((long)local_60 + ((ulong)(uVar13 ^ 1) - 8)) + 1;
    *(char *)((long)local_60 + ((ulong)(uVar13 ^ 1) - 8)) = (char)local_88;
    goto LAB_009790ab;
  case 5:
  case 0xd:
  case 0x15:
  case 0x1d:
  case 0x25:
  case 0x2d:
  case 0x3d:
    uVar13 = bVar1 >> 3 & 7;
    local_88 = *(byte *)((long)local_60 + ((ulong)(uVar13 ^ 1) - 8)) - 1;
    *(char *)((long)local_60 + ((ulong)(uVar13 ^ 1) - 8)) = (char)local_88;
    goto LAB_00979165;
  case 6:
    local_68._0_2_ = CONCAT11(bVar2,bVar3);
    local_6c = local_6c + 2;
    goto LAB_0097842d;
  case 7:
  case 0x17:
switchD_009784ce_caseD_7:
    local_6c = uVar10;
    local_84 = (uint)bVar8;
    local_88 = uVar13;
    goto LAB_00978bd4;
  case 8:
    get_le16(p);
    Gbs_Emu::cpu_write(in_RDI,(gb_addr_t)(uVar15 >> 0x20),(int)uVar15);
    Gbs_Emu::cpu_write(in_RDI,(gb_addr_t)(uVar15 >> 0x20),(int)uVar15);
    local_6c = local_6c + 3;
    goto LAB_0097842d;
  case 9:
  case 0x19:
  case 0x29:
    local_b8 = (uint)*(ushort *)((long)local_60 + (ulong)(bVar1 >> 4) * 2 + -8);
    goto LAB_0097923e;
  case 10:
    local_94 = (uint)uVar4;
    local_6c = uVar10;
    goto LAB_0097860b;
  case 0xb:
  case 0x1b:
  case 0x2b:
    *(short *)((long)local_60 + (ulong)(bVar1 >> 4) * 2 + -8) =
         *(short *)((long)local_60 + (ulong)(bVar1 >> 4) * 2 + -8) + -1;
    local_6c = uVar10;
    goto LAB_0097842d;
  case 0xe:
    local_68 = (_func_int **)CONCAT71(local_68._1_7_,bVar2);
    local_6c = local_6c + 2;
    goto LAB_0097842d;
  case 0xf:
  case 0x1f:
    local_84 = (uint)bVar8;
    local_88 = uVar13;
    local_6c = uVar10;
    goto LAB_00978c2e;
  case 0x10:
  case 0x27:
  case 0x76:
  case 0xbf:
  case 0xd3:
  case 0xdb:
  case 0xdd:
  case 0xe3:
  case 0xe4:
  case 0xeb:
  case 0xec:
  case 0xed:
  case 0xf4:
  case 0xfc:
  case 0xfd:
    local_18 = iVar11;
    goto switchD_009784ce_default;
  case 0x12:
    local_6c = uVar10;
    break;
  case 0x16:
    local_68._0_4_ = CONCAT13(bVar2,(undefined3)local_68);
    local_6c = local_6c + 2;
    goto LAB_0097842d;
  case 0x18:
    in_stack_ffffffffffffff40 = (int)(char)bVar2;
    local_6c = local_6c + 2 + in_stack_ffffffffffffff40 & 0xffff;
    goto LAB_0097842d;
  case 0x1a:
    local_94 = (uint)uVar6;
    local_6c = uVar10;
    goto LAB_0097860b;
  case 0x1e:
    local_68._0_3_ = CONCAT12(bVar2,uVar4);
    local_6c = local_6c + 2;
    goto LAB_0097842d;
  case 0x20:
    local_6c = local_6c + 2;
    if ((local_74 & 0x80) == 0) {
      local_6c = local_6c + (int)(char)bVar2 & 0xffff;
    }
    goto LAB_0097842d;
  case 0x21:
    uVar10 = get_le16(p);
    local_68._0_6_ = CONCAT24((short)uVar10,(undefined4)local_68);
    local_6c = local_6c + 3;
    goto LAB_0097842d;
  case 0x22:
    local_68._0_6_ = CONCAT24(uVar7 + 1,uVar5);
    local_6c = uVar10;
    break;
  case 0x26:
    local_68._0_6_ = CONCAT15(bVar2,(undefined5)local_68);
    local_6c = local_6c + 2;
    goto LAB_0097842d;
  case 0x28:
    local_6c = local_6c + 2;
    if ((local_74 & 0x80) != 0) {
      local_6c = local_6c + (int)(char)bVar2 & 0xffff;
    }
    goto LAB_0097842d;
  case 0x2a:
    local_94 = (uint)uVar7;
    local_68._0_6_ = CONCAT24(uVar7 + 1,uVar5);
    local_6c = uVar10;
    goto LAB_0097860b;
  case 0x2e:
    local_68._0_5_ = CONCAT14(bVar2,uVar5);
    local_6c = local_6c + 2;
    goto LAB_0097842d;
  case 0x2f:
    local_68 = (_func_int **)((ulong)local_68 ^ 0xff000000000000);
    local_74 = local_74 | 0x60;
    local_6c = uVar10;
    goto LAB_0097842d;
  case 0x30:
    local_6c = local_6c + 2;
    in_stack_ffffffffffffff3c = (int)(char)bVar2;
    if ((local_74 & 0x10) == 0) {
      local_6c = local_6c + in_stack_ffffffffffffff3c & 0xffff;
    }
    goto LAB_0097842d;
  case 0x31:
    local_70 = get_le16(p);
    local_6c = local_6c + 3;
    goto LAB_0097842d;
  case 0x32:
    local_68._0_6_ = CONCAT24(uVar7 - 1,uVar5);
    local_6c = uVar10;
    break;
  case 0x33:
    local_70 = local_70 + 1 & 0xffff;
    local_6c = uVar10;
    goto LAB_0097842d;
  case 0x34:
    iVar11 = Gbs_Emu::cpu_read(in_RDI,0);
    local_88 = iVar11 + 1;
    Gbs_Emu::cpu_write(in_RDI,(gb_addr_t)(uVar15 >> 0x20),(int)uVar15);
LAB_009790ab:
    local_74 = local_74 & 0x10 | (local_88 & 0xf) - 1 & 0x20 | local_88 >> 1 & 0x80;
    local_6c = uVar10;
    goto LAB_0097842d;
  case 0x35:
    iVar11 = Gbs_Emu::cpu_read(in_RDI,0);
    local_88 = iVar11 - 1;
    Gbs_Emu::cpu_write(in_RDI,(gb_addr_t)(uVar15 >> 0x20),(int)uVar15);
LAB_00979165:
    local_74 = local_74 & 0x10 | 0x40 | (local_88 & 0xf) + 0x31 & 0x20;
    local_6c = uVar10;
    if ((local_88 & 0xff) == 0) {
      local_74 = local_74 | 0x80;
    }
    goto LAB_0097842d;
  case 0x36:
    Gbs_Emu::cpu_write(in_RDI,0,uVar13);
    local_6c = local_6c + 2;
    goto LAB_0097842d;
  case 0x37:
    local_74 = local_74 & 0xffffff9f | 0x10;
    local_6c = uVar10;
    goto LAB_0097842d;
  case 0x38:
    local_6c = local_6c + 2;
    in_stack_ffffffffffffff38 = (uint)(char)bVar2;
    if ((local_74 & 0x10) != 0) {
      local_6c = local_6c + in_stack_ffffffffffffff38 & 0xffff;
    }
    goto LAB_0097842d;
  case 0x39:
    local_b8 = local_70;
LAB_0097923e:
    in_stack_ffffffffffffff44 = (uint)uVar7;
    local_b8 = in_stack_ffffffffffffff44 + local_b8;
    local_74 = local_74 & 0x80;
    local_6c = uVar10;
LAB_00979263:
    local_68._0_6_ = CONCAT24((short)local_b8,uVar5);
LAB_0097926f:
    local_74 = (local_b8 & 0xfff) - (in_stack_ffffffffffffff44 & 0xfff) >> 7 & 0x20 |
               local_b8 >> 0xc & 0x10 | local_74;
    goto LAB_0097842d;
  case 0x3a:
    local_94 = (uint)uVar7;
    local_68._0_6_ = CONCAT24(uVar7 - 1,uVar5);
    local_6c = uVar10;
    goto LAB_0097860b;
  case 0x3b:
    local_70 = local_70 - 1 & 0xffff;
    local_6c = uVar10;
    goto LAB_0097842d;
  case 0x3e:
    local_68._0_7_ = CONCAT16(bVar2,(uint6)local_68);
    local_68 = (_func_int **)CONCAT17(uVar9,(uint7)local_68);
    local_6c = local_6c + 2;
    goto LAB_0097842d;
  case 0x3f:
    local_74 = (local_74 ^ 0x10) & 0xffffff9f;
    local_6c = uVar10;
    goto LAB_0097842d;
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x47:
  case 0x48:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5c:
  case 0x5d:
  case 0x5f:
  case 0x60:
  case 0x61:
  case 0x62:
  case 99:
  case 0x65:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6f:
  case 0x78:
  case 0x79:
  case 0x7a:
  case 0x7b:
  case 0x7c:
  case 0x7d:
    *(undefined1 *)((long)local_60 + ((ulong)(bVar1 >> 3 & 7 ^ 1) - 8)) =
         *(undefined1 *)((long)local_60 + ((ulong)(uVar13 & 7 ^ 1) - 8));
    local_6c = uVar10;
    goto LAB_0097842d;
  case 0x46:
  case 0x4e:
  case 0x56:
  case 0x5e:
  case 0x66:
  case 0x6e:
  case 0x7e:
    *(undefined1 *)((long)local_60 + ((ulong)(bVar1 >> 3 & 7 ^ 1) - 8)) =
         *(undefined1 *)(local_60[uVar7 >> 0xd] + (ulong)(uVar7 & 0x1fff));
    local_6c = uVar10;
    if (uVar7 - 0xff10 < 0x30) {
      iVar11 = Gb_Apu::read_register
                         ((Gb_Apu *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                          in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
      *(char *)((long)local_60 + ((ulong)(bVar1 >> 3 & 7 ^ 1) - 8)) = (char)iVar11;
    }
    goto LAB_0097842d;
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x73:
  case 0x74:
  case 0x75:
  case 0x77:
    local_6c = uVar10;
    goto LAB_00978cf2;
  case 0x80:
  case 0x81:
  case 0x82:
  case 0x83:
  case 0x84:
  case 0x85:
  case 0x87:
    local_88 = (uint)*(byte *)((long)local_60 + ((ulong)(uVar13 & 7 ^ 1) - 8));
    local_6c = uVar10;
    goto LAB_009792ed;
  case 0x86:
    local_88 = Gbs_Emu::cpu_read(in_RDI,0);
    local_6c = uVar10;
    goto LAB_009792ed;
  case 0x88:
  case 0x89:
  case 0x8a:
  case 0x8b:
  case 0x8c:
  case 0x8d:
  case 0x8f:
    local_88 = (uint)*(byte *)((long)local_60 + ((ulong)(uVar13 & 7 ^ 1) - 8));
    local_6c = uVar10;
    goto LAB_009793a2;
  case 0x8e:
    local_88 = Gbs_Emu::cpu_read(in_RDI,0);
    local_6c = uVar10;
    goto LAB_009793a2;
  case 0x90:
  case 0x91:
  case 0x92:
  case 0x93:
  case 0x94:
  case 0x95:
  case 0x97:
    local_88 = (uint)*(byte *)((long)local_60 + ((ulong)(uVar13 & 7 ^ 1) - 8));
    local_6c = uVar10;
    goto LAB_0097940a;
  case 0x96:
    local_88 = Gbs_Emu::cpu_read(in_RDI,0);
    local_6c = uVar10;
    goto LAB_0097940a;
  case 0x98:
  case 0x99:
  case 0x9a:
  case 0x9b:
  case 0x9c:
  case 0x9d:
  case 0x9f:
    local_88 = (uint)*(byte *)((long)local_60 + ((ulong)(uVar13 & 7 ^ 1) - 8));
    local_6c = uVar10;
    goto LAB_00979476;
  case 0x9e:
    local_88 = Gbs_Emu::cpu_read(in_RDI,0);
    local_6c = uVar10;
    goto LAB_00979476;
  case 0xa0:
  case 0xa1:
  case 0xa2:
  case 0xa3:
  case 0xa4:
  case 0xa5:
    local_88._0_1_ = *(byte *)((long)local_60 + ((ulong)(uVar13 & 7 ^ 1) - 8));
    local_6c = uVar10;
    goto LAB_009794e7;
  case 0xa6:
    iVar11 = Gbs_Emu::cpu_read(in_RDI,0);
    uVar10 = local_6c;
    bVar2 = (byte)iVar11;
  case 0xe6:
    local_88._0_1_ = bVar2;
    local_6c = uVar10;
    local_6c = local_6c + 1;
LAB_009794e7:
    local_68._0_7_ = CONCAT16(local_68._6_1_ & (byte)local_88,(uint6)local_68);
    uVar10 = local_6c;
switchD_009784ce_caseD_a7:
    local_6c = uVar10;
    local_74 = (int)(local_68._6_1_ - 1) >> 1 & 0x80U | 0x20;
    goto LAB_0097842d;
  case 0xa7:
    goto switchD_009784ce_caseD_a7;
  case 0xa8:
  case 0xa9:
  case 0xaa:
  case 0xab:
  case 0xac:
  case 0xad:
    local_88 = (uint)*(byte *)((long)local_60 + ((ulong)(uVar13 & 7 ^ 1) - 8));
    local_6c = uVar10;
    goto LAB_009795e4;
  case 0xae:
    local_88 = Gbs_Emu::cpu_read(in_RDI,0);
    uVar10 = local_6c;
  case 0xee:
    local_6c = uVar10;
    local_6c = local_6c + 1;
LAB_009795e4:
    uVar10 = (uint)local_68._6_1_;
    local_68._0_7_ = CONCAT16((char)(uVar10 ^ local_88),(uint6)local_68);
    local_74 = (uVar10 ^ local_88) - 1 >> 1 & 0x80;
    goto LAB_0097842d;
  case 0xaf:
    local_68._0_7_ = (uint7)(uint6)local_68;
    local_68 = (_func_int **)CONCAT17(uVar9,(uint7)local_68);
    local_74 = 0x80;
    local_6c = uVar10;
    goto LAB_0097842d;
  case 0xb0:
  case 0xb1:
  case 0xb2:
  case 0xb3:
  case 0xb4:
  case 0xb5:
    local_88._0_1_ = *(byte *)((long)local_60 + ((ulong)(uVar13 & 7 ^ 1) - 8));
    local_6c = uVar10;
    goto LAB_00979567;
  case 0xb6:
    iVar11 = Gbs_Emu::cpu_read(in_RDI,0);
    uVar10 = local_6c;
    bVar2 = (byte)iVar11;
  case 0xf6:
    local_88._0_1_ = bVar2;
    local_6c = uVar10;
    local_6c = local_6c + 1;
LAB_00979567:
    local_68._0_7_ = CONCAT16(local_68._6_1_ | (byte)local_88,(uint6)local_68);
    uVar10 = local_6c;
switchD_009784ce_caseD_b7:
    local_6c = uVar10;
    local_74 = (int)(local_68._6_1_ - 1) >> 1 & 0x80;
    goto LAB_0097842d;
  case 0xb7:
    goto switchD_009784ce_caseD_b7;
  case 0xb8:
  case 0xb9:
  case 0xba:
  case 0xbb:
  case 0xbc:
  case 0xbd:
    local_88 = (uint)*(byte *)((long)local_60 + ((ulong)(uVar13 & 7 ^ 1) - 8));
    local_6c = uVar10;
    goto LAB_009786c5;
  case 0xbe:
    local_88 = Gbs_Emu::cpu_read(in_RDI,0);
    local_6c = uVar10;
    goto LAB_009786c5;
  case 0xc0:
    uVar13 = local_74 & 0x80;
    goto joined_r0x009797cd;
  case 0xc1:
  case 0xd1:
  case 0xe1:
  case 0xf1:
    iVar11 = Gbs_Emu::cpu_read(in_RDI,0);
    iVar12 = Gbs_Emu::cpu_read(in_RDI,(gb_addr_t)(uVar15 >> 0x20));
    *(short *)((long)local_60 + (ulong)(bVar1 >> 4 & 3) * 2 + -8) =
         (short)iVar11 + (short)(iVar12 << 8);
    local_70 = local_70 + 2 & 0xffff;
    local_6c = uVar10;
    if (uVar13 == 0xf1) {
      local_74 = local_68._7_1_ & 0xf0;
    }
    goto LAB_0097842d;
  case 0xc2:
    uVar10 = local_74 & 0x80;
    goto joined_r0x00979926;
  case 0xc3:
    local_6c = get_le16(p);
    goto LAB_0097842d;
  case 0xc4:
    uVar10 = local_74 & 0x80;
    goto joined_r0x00979779;
  case 0xc5:
    local_6c = uVar10;
    goto LAB_0097881c;
  case 0xc6:
    local_6c = local_6c + 2;
    goto LAB_009792ed;
  case 199:
  case 0xcf:
  case 0xd7:
  case 0xdf:
  case 0xe7:
  case 0xef:
  case 0xf7:
    goto switchD_009784ce_caseD_c7;
  case 200:
    local_6c = uVar10;
    if ((local_74 & 0x80) != 0) goto switchD_009784ce_caseD_c9;
    goto LAB_0097842d;
  case 0xc9:
switchD_009784ce_caseD_c9:
    goto LAB_00978893;
  case 0xca:
    uVar10 = local_74 & 0x80;
    goto joined_r0x00979944;
  case 0xcb:
    local_6c = local_6c + 2;
    uVar10 = local_6c;
    switch(local_88) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 7:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x17:
    case 0x20:
    case 0x21:
    case 0x22:
    case 0x23:
    case 0x24:
    case 0x25:
    case 0x27:
      local_84 = (uint)*(byte *)((long)local_60 + ((ulong)(local_88 & 7 ^ 1) - 8));
      break;
    case 6:
    case 0x16:
    case 0x26:
      local_84 = Gbs_Emu::cpu_read(in_RDI,0);
      break;
    case 0x30:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x37:
      local_b0 = (uint)*(byte *)((long)local_60 + ((ulong)(local_88 & 7 ^ 1) - 8));
      goto LAB_00978b0f;
    case 0x36:
      local_b0 = Gbs_Emu::cpu_read(in_RDI,0);
LAB_00978b0f:
      local_84 = (int)local_b0 >> 4 | local_b0 << 4;
      local_74 = 0;
      goto LAB_00978c90;
    case 0x38:
    case 0x39:
    case 0x3a:
    case 0x3b:
    case 0x3c:
    case 0x3d:
    case 0x3f:
      local_88 = local_88 + 0x10;
    case 8:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xf:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1f:
    case 0x28:
    case 0x29:
    case 0x2a:
    case 0x2b:
    case 0x2c:
    case 0x2d:
    case 0x2f:
      local_84 = (uint)*(byte *)((long)local_60 + ((ulong)(local_88 & 7 ^ 1) - 8));
      goto LAB_00978c2e;
    case 0x3e:
      local_88 = local_88 + 0x10;
    case 0xe:
    case 0x1e:
    case 0x2e:
      local_84 = Gbs_Emu::cpu_read(in_RDI,0);
LAB_00978c2e:
      uVar10 = (local_88 & local_74) << 4 | local_84;
      local_74 = (local_84 & 1) << 4;
      local_84 = uVar10;
      if (local_88 < 0x10) {
        local_84 = uVar10 << 8 | uVar10;
      }
      local_84 = local_84 >> 1;
      if ((local_88 & 0x20) != 0) {
        local_84 = (local_84 & 0x40) << 1 | local_84;
      }
      goto LAB_00978c90;
    case 0x40:
    case 0x41:
    case 0x42:
    case 0x43:
    case 0x44:
    case 0x45:
    case 0x47:
    case 0x48:
    case 0x49:
    case 0x4a:
    case 0x4b:
    case 0x4c:
    case 0x4d:
    case 0x4f:
    case 0x50:
    case 0x51:
    case 0x52:
    case 0x53:
    case 0x54:
    case 0x55:
    case 0x57:
    case 0x58:
    case 0x59:
    case 0x5a:
    case 0x5b:
    case 0x5c:
    case 0x5d:
    case 0x5f:
    case 0x60:
    case 0x61:
    case 0x62:
    case 99:
    case 100:
    case 0x65:
    case 0x67:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x72:
    case 0x73:
    case 0x74:
    case 0x75:
    case 0x77:
    case 0x78:
    case 0x79:
    case 0x7a:
    case 0x7b:
    case 0x7c:
    case 0x7d:
    case 0x7f:
      local_9c = (uint)*(byte *)((long)local_60 + ((ulong)(local_88 & 7 ^ 1) - 8));
      goto LAB_009789af;
    case 0x46:
    case 0x4e:
    case 0x56:
    case 0x5e:
    case 0x66:
    case 0x6e:
    case 0x76:
    case 0x7e:
      local_9c = (uint)*(byte *)(local_60[uVar7 >> 0xd] + (ulong)(uVar7 & 0x1fff));
      if (uVar7 - 0xff10 < 0x30) {
        local_9c = Gb_Apu::read_register
                             ((Gb_Apu *)
                              CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                              in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
      }
LAB_009789af:
      local_74 = local_9c << ((byte)((local_88 ^ 0xffffffff) >> 3) & 7) & 0x80 ^
                 (local_74 & 0xffffffbf | 0xa0);
      goto LAB_0097842d;
    case 0x80:
    case 0x81:
    case 0x82:
    case 0x83:
    case 0x84:
    case 0x85:
    case 0x87:
    case 0x88:
    case 0x89:
    case 0x8a:
    case 0x8b:
    case 0x8c:
    case 0x8d:
    case 0x8f:
    case 0x90:
    case 0x91:
    case 0x92:
    case 0x93:
    case 0x94:
    case 0x95:
    case 0x97:
    case 0x98:
    case 0x99:
    case 0x9a:
    case 0x9b:
    case 0x9c:
    case 0x9d:
    case 0x9f:
    case 0xa0:
    case 0xa1:
    case 0xa2:
    case 0xa3:
    case 0xa4:
    case 0xa5:
    case 0xa7:
    case 0xa8:
    case 0xa9:
    case 0xaa:
    case 0xab:
    case 0xac:
    case 0xad:
    case 0xaf:
    case 0xb0:
    case 0xb1:
    case 0xb2:
    case 0xb3:
    case 0xb4:
    case 0xb5:
    case 0xb7:
    case 0xb8:
    case 0xb9:
    case 0xba:
    case 0xbb:
    case 0xbc:
    case 0xbd:
    case 0xbf:
      uVar15 = (ulong)(local_88 & 7 ^ 1);
      *(byte *)((long)local_60 + (uVar15 - 8)) =
           *(byte *)((long)local_60 + (uVar15 - 8)) & ((byte)(1 << (bVar2 >> 3 & 7)) ^ 0xff);
      goto LAB_0097842d;
    case 0x86:
    case 0x8e:
    case 0x96:
    case 0x9e:
    case 0xa6:
    case 0xae:
    case 0xb6:
    case 0xbe:
    case 0xc6:
    case 0xce:
    case 0xd6:
    case 0xde:
    case 0xe6:
    case 0xee:
    case 0xf6:
    case 0xfe:
      Gbs_Emu::cpu_read(in_RDI,0);
      Gbs_Emu::cpu_write(in_RDI,(gb_addr_t)(uVar15 >> 0x20),(int)uVar15);
      goto LAB_0097842d;
    case 0xc0:
    case 0xc1:
    case 0xc2:
    case 0xc3:
    case 0xc4:
    case 0xc5:
    case 199:
    case 200:
    case 0xc9:
    case 0xca:
    case 0xcb:
    case 0xcc:
    case 0xcd:
    case 0xcf:
    case 0xd0:
    case 0xd1:
    case 0xd2:
    case 0xd3:
    case 0xd4:
    case 0xd5:
    case 0xd7:
    case 0xd8:
    case 0xd9:
    case 0xda:
    case 0xdb:
    case 0xdc:
    case 0xdd:
    case 0xdf:
    case 0xe0:
    case 0xe1:
    case 0xe2:
    case 0xe3:
    case 0xe4:
    case 0xe5:
    case 0xe7:
    case 0xe8:
    case 0xe9:
    case 0xea:
    case 0xeb:
    case 0xec:
    case 0xed:
    case 0xef:
    case 0xf0:
    case 0xf1:
    case 0xf2:
    case 0xf3:
    case 0xf4:
    case 0xf5:
    case 0xf7:
    case 0xf8:
    case 0xf9:
    case 0xfa:
    case 0xfb:
    case 0xfc:
    case 0xfd:
    case 0xff:
      uVar15 = (ulong)(local_88 & 7 ^ 1);
      *(byte *)((long)local_60 + (uVar15 - 8)) =
           *(byte *)((long)local_60 + (uVar15 - 8)) | (byte)(1 << (bVar2 >> 3 & 7));
      goto LAB_0097842d;
    default:
      goto switchD_009784ce_caseD_7;
    }
LAB_00978bd4:
    uVar10 = local_84 << 1;
    local_84 = (local_88 & local_74) >> 4 & 1 | uVar10;
    local_74 = (uVar10 & 0x100) >> 4;
    if (local_88 < 0x10) {
      local_84 = uVar10 >> 8 | local_84;
    }
LAB_00978c90:
    if ((local_84 & 0xff) == 0) {
      local_74 = local_74 | 0x80;
    }
    if ((local_88 & 7) == 6) {
LAB_00978cf2:
      Gbs_Emu::cpu_write(in_RDI,(gb_addr_t)(uVar15 >> 0x20),(int)uVar15);
    }
    else {
      *(char *)((long)local_60 + ((ulong)(local_88 & 7 ^ 1) - 8)) = (char)local_84;
    }
    goto LAB_0097842d;
  case 0xcc:
    uVar10 = local_74 & 0x80;
    goto joined_r0x0097979a;
  case 0xcd:
    goto switchD_009784ce_caseD_cd;
  case 0xce:
    local_6c = local_6c + 2;
LAB_009793a2:
    local_88 = (local_74 >> 4 & 1) + local_88 & 0xff;
LAB_009792ed:
    local_88 = local_68._6_1_ + local_88;
    local_74 = local_88 >> 4 & 0x10 | (local_88 & 0xf) - (local_68._6_1_ & 0xf) & 0x20;
    local_68._0_7_ = CONCAT16((char)local_88,(uint6)local_68);
    if ((local_88 & 0xff) == 0) {
      local_74 = local_74 | 0x80;
    }
    goto LAB_0097842d;
  case 0xd0:
    uVar13 = local_74 & 0x10;
joined_r0x009797cd:
    local_6c = uVar10;
    if (uVar13 == 0) goto LAB_00978893;
    goto LAB_0097842d;
  case 0xd2:
    uVar10 = local_74 & 0x10;
joined_r0x00979926:
    local_6c = local_6c + 3;
    if (uVar10 == 0) {
LAB_009798f3:
      local_6c = get_le16(p);
    }
    goto LAB_0097842d;
  case 0xd4:
    uVar10 = local_74 & 0x10;
joined_r0x00979779:
    local_6c = local_6c + 3;
    if (uVar10 == 0) {
switchD_009784ce_caseD_cd:
      local_6c = get_le16(p);
      goto LAB_0097881c;
    }
    goto LAB_0097842d;
  case 0xd5:
    local_6c = uVar10;
    goto LAB_0097881c;
  case 0xd6:
    local_6c = local_6c + 2;
    goto LAB_0097940a;
  case 0xd8:
    local_6c = uVar10;
    if ((local_74 & 0x10) != 0) goto LAB_00978893;
    goto LAB_0097842d;
  case 0xd9:
LAB_00978893:
    iVar11 = Gbs_Emu::cpu_read(in_RDI,0);
    iVar12 = Gbs_Emu::cpu_read(in_RDI,(gb_addr_t)(uVar15 >> 0x20));
    local_70 = local_70 + 2 & 0xffff;
    local_6c = iVar12 * 0x100 + iVar11;
    goto LAB_0097842d;
  case 0xda:
    uVar10 = local_74 & 0x10;
joined_r0x00979944:
    local_6c = local_6c + 3;
    if (uVar10 != 0) goto LAB_009798f3;
    goto LAB_0097842d;
  case 0xdc:
    uVar10 = local_74 & 0x10;
joined_r0x0097979a:
    local_6c = local_6c + 3;
    if (uVar10 != 0) goto switchD_009784ce_caseD_cd;
    goto LAB_0097842d;
  case 0xde:
    local_6c = local_6c + 2;
LAB_00979476:
    local_88 = (local_74 >> 4 & 1) + local_88 & 0xff;
LAB_0097940a:
    local_84 = (uint)local_68._6_1_;
    local_88 = local_84 - local_88;
    local_68._0_7_ = CONCAT16((char)local_88,(uint6)local_68);
LAB_009786dd:
    uVar10 = local_88 >> 4 & 0x10 | (local_84 & 0xf) - (local_88 & 0xf) & 0x20;
    local_74 = uVar10 | 0x40;
    if ((local_88 & 0xff) == 0) {
      local_74 = uVar10 | 0xc0;
    }
    goto LAB_0097842d;
  case 0xe0:
    local_6c = local_6c + 2;
    break;
  case 0xe2:
    local_6c = uVar10;
    break;
  case 0xe5:
    local_6c = uVar10;
    goto LAB_0097881c;
  case 0xe8:
    local_6c = local_6c + 2;
    local_74 = 0;
    local_b8 = local_70 + (int)(char)bVar2;
    in_stack_ffffffffffffff44 = local_70;
    local_70 = local_b8 & 0xffff;
    goto LAB_0097926f;
  case 0xe9:
    local_6c = (uint)uVar7;
    goto LAB_0097842d;
  case 0xea:
    get_le16(p);
    local_6c = local_6c + 3;
    break;
  case 0xf0:
    local_94 = local_88 | 0xff00;
    local_6c = local_6c + 2;
    goto LAB_0097860b;
  case 0xf2:
    local_94 = bVar3 | 0xff00;
    local_6c = uVar10;
    goto LAB_0097860b;
  case 0xf3:
    local_6c = uVar10;
    goto LAB_0097842d;
  case 0xf5:
    local_6c = uVar10;
    goto LAB_0097881c;
  case 0xf8:
    local_74 = 0;
    local_b8 = local_70 + (int)(char)bVar2;
    in_stack_ffffffffffffff44 = local_70;
    local_6c = local_6c + 2;
    goto LAB_00979263;
  case 0xf9:
    local_70 = (uint)uVar7;
    local_6c = uVar10;
    goto LAB_0097842d;
  case 0xfa:
    local_94 = get_le16(p);
    local_6c = local_6c + 3;
LAB_0097860b:
    local_68._0_7_ =
         CONCAT16(*(undefined1 *)(local_60[local_94 >> 0xd] + (ulong)(local_94 & 0x1fff)),
                  (uint6)local_68);
    if (local_94 - 0xff10 < 0x30) {
      iVar11 = Gb_Apu::read_register
                         ((Gb_Apu *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                          in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
      local_68._0_7_ = CONCAT16((char)iVar11,(uint6)local_68);
    }
    goto LAB_0097842d;
  case 0xfb:
    goto switchD_009784ce_caseD_fb;
  case 0xfe:
    local_6c = local_6c + 2;
LAB_009786c5:
    local_84 = (uint)local_68._6_1_;
    local_88 = local_84 - local_88;
    goto LAB_009786dd;
  case 0xff:
    if (uVar10 == 0xf00e) goto switchD_009784ce_default;
switchD_009784ce_caseD_c7:
    local_6c = (uVar13 & 0x38) +
               *(int *)&(in_RDI->super_Classic_Emu).super_Music_Emu.super_Gme_File.warning_;
LAB_0097881c:
    Gbs_Emu::cpu_write(in_RDI,(gb_addr_t)(uVar15 >> 0x20),(int)uVar15);
    local_70 = (local_70 - 1 & 0xffff) - 1 & 0xffff;
    Gbs_Emu::cpu_write(in_RDI,(gb_addr_t)(uVar15 >> 0x20),(int)uVar15);
    goto LAB_0097842d;
  default:
    goto switchD_009784ce_default;
  }
  Gbs_Emu::cpu_write(in_RDI,(gb_addr_t)(uVar15 >> 0x20),(int)uVar15);
  goto LAB_0097842d;
switchD_009784ce_caseD_fb:
  local_6c = uVar10;
  goto LAB_0097842d;
}

Assistant:

bool Gb_Cpu::run( blargg_long cycle_count )
{
	state_.remain = blargg_ulong (cycle_count + clocks_per_instr) / clocks_per_instr;
	state_t s;
	this->state = &s;
	memcpy( &s, &this->state_, sizeof s );
	
	typedef BOOST::uint16_t uint16_t;
	
#if BLARGG_BIG_ENDIAN
	#define R8( n ) (r8_ [n]) 
#elif BLARGG_LITTLE_ENDIAN
	#define R8( n ) (r8_ [(n) ^ 1]) 
#else
	#error "Byte order of CPU must be known"
#endif
	
	union {
		core_regs_t rg; // individual registers
		
		struct {
			BOOST::uint16_t bc, de, hl, unused; // pairs
		} rp;
		
		uint8_t r8_ [8]; // indexed registers (use R8 macro due to endian dependence)
		BOOST::uint16_t r16 [4]; // indexed pairs
	};
	BOOST_STATIC_ASSERT( sizeof rg == 8 && sizeof rp == 8 );
	
	rg = r;
	unsigned pc = r.pc;
	unsigned sp = r.sp;
	unsigned flags = r.flags;
	
loop:
	
	check( (unsigned long) pc < 0x10000 );
	check( (unsigned long) sp < 0x10000 );
	check( (flags & ~0xF0) == 0 );
	
	uint8_t const* instr = s.code_map [pc >> page_shift];
	unsigned op;
	
	// TODO: eliminate this special case
	#if BLARGG_NONPORTABLE
		op = instr [pc];
		pc++;
		instr += pc;
	#else
		instr += PAGE_OFFSET( pc );
		op = *instr++;
		pc++;
	#endif
	
#define GET_ADDR()  GET_LE16( instr )
	
	if ( !--s.remain )
		goto stop;
	
	unsigned data;
	data = *instr;
	
	#ifdef GB_CPU_LOG_H
		gb_cpu_log( "new", pc - 1, op, data, instr [1] );
	#endif
	
	switch ( op )
	{

// TODO: more efficient way to handle negative branch that wraps PC around
#define BRANCH( cond )\
{\
	pc++;\
	int offset = (BOOST::int8_t) data;\
	if ( !(cond) ) goto loop;\
	pc = uint16_t (pc + offset);\
	goto loop;\
}

// Most Common

	case 0x20: // JR NZ
		BRANCH( !(flags & z_flag) )
	
	case 0x21: // LD HL,IMM (common)
		rp.hl = GET_ADDR();
		pc += 2;
		goto loop;
	
	case 0x28: // JR Z
		BRANCH( flags & z_flag )
	
	{
		unsigned temp;
	case 0xF0: // LD A,(0xFF00+imm)
		temp = data | 0xFF00;
		pc++;
		goto ld_a_ind_comm;
	
	case 0xF2: // LD A,(0xFF00+C)
		temp = rg.c | 0xFF00;
		goto ld_a_ind_comm;
	
	case 0x0A: // LD A,(BC)
		temp = rp.bc;
		goto ld_a_ind_comm;
	
	case 0x3A: // LD A,(HL-)
		temp = rp.hl;
		rp.hl = temp - 1;
		goto ld_a_ind_comm;
	
	case 0x1A: // LD A,(DE)
		temp = rp.de;
		goto ld_a_ind_comm;
	
	case 0x2A: // LD A,(HL+) (common)
		temp = rp.hl;
		rp.hl = temp + 1;
		goto ld_a_ind_comm;
		
	case 0xFA: // LD A,IND16 (common)
		temp = GET_ADDR();
		pc += 2;
	ld_a_ind_comm:
		READ_FAST( temp, rg.a );
		goto loop;
	}
	
	case 0xBE: // CMP (HL)
		data = READ( rp.hl );
		goto cmp_comm;
	
	case 0xB8: // CMP B
	case 0xB9: // CMP C
	case 0xBA: // CMP D
	case 0xBB: // CMP E
	case 0xBC: // CMP H
	case 0xBD: // CMP L
		data = R8( op & 7 );
		goto cmp_comm;
	
	case 0xFE: // CMP IMM
		pc++;
	cmp_comm:
		op = rg.a;
		data = op - data;
	sub_set_flags:
		flags = ((op & 15) - (data & 15)) & h_flag;
		flags |= (data >> 4) & c_flag;
		flags |= n_flag;
		if ( data & 0xFF )
			goto loop;
		flags |= z_flag;
		goto loop;

	case 0x46: // LD B,(HL)
	case 0x4E: // LD C,(HL)
	case 0x56: // LD D,(HL)
	case 0x5E: // LD E,(HL)
	case 0x66: // LD H,(HL)
	case 0x6E: // LD L,(HL)
	case 0x7E:{// LD A,(HL)
		unsigned addr = rp.hl;
		READ_FAST( addr, R8( (op >> 3) & 7 ) );
		goto loop;
	}
	
	case 0xC4: // CNZ (next-most-common)
		pc += 2;
		if ( flags & z_flag )
			goto loop;
	call:
		pc -= 2;
	case 0xCD: // CALL (most-common)
		data = pc + 2;
		pc = GET_ADDR();
	push:
		sp = (sp - 1) & 0xFFFF;
		WRITE( sp, data >> 8 );
		sp = (sp - 1) & 0xFFFF;
		WRITE( sp, data & 0xFF );
		goto loop;
	
	case 0xC8: // RNZ (next-most-common)
		if ( !(flags & z_flag) )
			goto loop;
	case 0xC9: // RET (most common)
	ret:
		pc = READ( sp );
		pc += 0x100 * READ( sp + 1 );
		sp = (sp + 2) & 0xFFFF;
		goto loop;
	
	case 0x00: // NOP
	case 0x40: // LD B,B
	case 0x49: // LD C,C
	case 0x52: // LD D,D
	case 0x5B: // LD E,E
	case 0x64: // LD H,H
	case 0x6D: // LD L,L
	case 0x7F: // LD A,A
		goto loop;
	
// CB Instructions

	case 0xCB:
		pc++;
		// now data is the opcode
		switch ( data ) {
			
		{
			int temp;
		case 0x46: // BIT b,(HL)
		case 0x4E:
		case 0x56:
		case 0x5E:
		case 0x66:
		case 0x6E:
		case 0x76:
		case 0x7E:
			{
				unsigned addr = rp.hl;
				READ_FAST( addr, temp );
				goto bit_comm;
			}
		
		case 0x40: case 0x41: case 0x42: case 0x43: // BIT b,r
		case 0x44: case 0x45: case 0x47: case 0x48:
		case 0x49: case 0x4A: case 0x4B: case 0x4C:
		case 0x4D: case 0x4F: case 0x50: case 0x51:
		case 0x52: case 0x53: case 0x54: case 0x55:
		case 0x57: case 0x58: case 0x59: case 0x5A:
		case 0x5B: case 0x5C: case 0x5D: case 0x5F:
		case 0x60: case 0x61: case 0x62: case 0x63:
		case 0x64: case 0x65: case 0x67: case 0x68:
		case 0x69: case 0x6A: case 0x6B: case 0x6C:
		case 0x6D: case 0x6F: case 0x70: case 0x71:
		case 0x72: case 0x73: case 0x74: case 0x75:
		case 0x77: case 0x78: case 0x79: case 0x7A:
		case 0x7B: case 0x7C: case 0x7D: case 0x7F:
			temp = R8( data & 7 );
		bit_comm:
			int bit = (~data >> 3) & 7;
			flags &= ~n_flag;
			flags |= h_flag | z_flag;
			flags ^= (temp << bit) & z_flag;
			goto loop;
		}
		
		case 0x86: // RES b,(HL)
		case 0x8E:
		case 0x96:
		case 0x9E:
		case 0xA6:
		case 0xAE:
		case 0xB6:
		case 0xBE:
		case 0xC6: // SET b,(HL)
		case 0xCE:
		case 0xD6:
		case 0xDE:
		case 0xE6:
		case 0xEE:
		case 0xF6:
		case 0xFE: {
			int temp = READ( rp.hl );
			int bit = 1 << ((data >> 3) & 7);
			temp &= ~bit;
			if ( !(data & 0x40) )
				bit = 0;
			WRITE( rp.hl, temp | bit );
			goto loop;
		}
		
		case 0xC0: case 0xC1: case 0xC2: case 0xC3: // SET b,r
		case 0xC4: case 0xC5: case 0xC7: case 0xC8:
		case 0xC9: case 0xCA: case 0xCB: case 0xCC:
		case 0xCD: case 0xCF: case 0xD0: case 0xD1:
		case 0xD2: case 0xD3: case 0xD4: case 0xD5:
		case 0xD7: case 0xD8: case 0xD9: case 0xDA:
		case 0xDB: case 0xDC: case 0xDD: case 0xDF:
		case 0xE0: case 0xE1: case 0xE2: case 0xE3:
		case 0xE4: case 0xE5: case 0xE7: case 0xE8:
		case 0xE9: case 0xEA: case 0xEB: case 0xEC:
		case 0xED: case 0xEF: case 0xF0: case 0xF1:
		case 0xF2: case 0xF3: case 0xF4: case 0xF5:
		case 0xF7: case 0xF8: case 0xF9: case 0xFA:
		case 0xFB: case 0xFC: case 0xFD: case 0xFF:
			R8( data & 7 ) |= 1 << ((data >> 3) & 7);
			goto loop;

		case 0x80: case 0x81: case 0x82: case 0x83: // RES b,r
		case 0x84: case 0x85: case 0x87: case 0x88:
		case 0x89: case 0x8A: case 0x8B: case 0x8C:
		case 0x8D: case 0x8F: case 0x90: case 0x91:
		case 0x92: case 0x93: case 0x94: case 0x95:
		case 0x97: case 0x98: case 0x99: case 0x9A:
		case 0x9B: case 0x9C: case 0x9D: case 0x9F:
		case 0xA0: case 0xA1: case 0xA2: case 0xA3:
		case 0xA4: case 0xA5: case 0xA7: case 0xA8:
		case 0xA9: case 0xAA: case 0xAB: case 0xAC:
		case 0xAD: case 0xAF: case 0xB0: case 0xB1:
		case 0xB2: case 0xB3: case 0xB4: case 0xB5:
		case 0xB7: case 0xB8: case 0xB9: case 0xBA:
		case 0xBB: case 0xBC: case 0xBD: case 0xBF:
			R8( data & 7 ) &= ~(1 << ((data >> 3) & 7));
			goto loop;
		
		{
			int temp;
		case 0x36: // SWAP (HL)
			temp = READ( rp.hl );
			goto swap_comm;
		
		case 0x30: // SWAP B
		case 0x31: // SWAP C
		case 0x32: // SWAP D
		case 0x33: // SWAP E
		case 0x34: // SWAP H
		case 0x35: // SWAP L
		case 0x37: // SWAP A
			temp = R8( data & 7 );
		swap_comm:
			op = (temp >> 4) | (temp << 4);
			flags = 0;
			goto shift_comm;
		}
		
// Shift/Rotate

		case 0x06: // RLC (HL)
		case 0x16: // RL (HL)
		case 0x26: // SLA (HL)
			op = READ( rp.hl );
			goto rl_comm;
		
		case 0x20: case 0x21: case 0x22: case 0x23: case 0x24: case 0x25: case 0x27: // SLA A
		case 0x00: case 0x01: case 0x02: case 0x03: case 0x04: case 0x05: case 0x07: // RLC A
		case 0x10: case 0x11: case 0x12: case 0x13: case 0x14: case 0x15: case 0x17: // RL A
			op = R8( data & 7 );
			goto rl_comm;
		
		case 0x3E: // SRL (HL)
			data += 0x10; // bump up to 0x4n to avoid preserving sign bit
		case 0x1E: // RR (HL)
		case 0x0E: // RRC (HL)
		case 0x2E: // SRA (HL)
			op = READ( rp.hl );
			goto rr_comm;
		
		case 0x38: case 0x39: case 0x3A: case 0x3B: case 0x3C: case 0x3D: case 0x3F: // SRL A
			data += 0x10; // bump up to 0x4n
		case 0x18: case 0x19: case 0x1A: case 0x1B: case 0x1C: case 0x1D: case 0x1F: // RR A
		case 0x08: case 0x09: case 0x0A: case 0x0B: case 0x0C: case 0x0D: case 0x0F: // RRC A
		case 0x28: case 0x29: case 0x2A: case 0x2B: case 0x2C: case 0x2D: case 0x2F: // SRA A
			op = R8( data & 7 );
			goto rr_comm;
		
	} // CB op
	assert( false ); // unhandled CB op

	case 0x07: // RLCA
	case 0x17: // RLA
		data = op;
		op = rg.a;
	rl_comm:
		op <<= 1;
		op |= ((data & flags) >> 4) & 1; // RL and carry is set
		flags = (op >> 4) & c_flag; // C = bit shifted out
		if ( data < 0x10 ) // RLC
			op |= op >> 8;
		// SLA doesn't fill lower bit
		goto shift_comm;
	
	case 0x0F: // RRCA
	case 0x1F: // RRA
		data = op;
		op = rg.a;
	rr_comm:
		op |= (data & flags) << 4; // RR and carry is set
		flags = (op << 4) & c_flag; // C = bit shifted out
		if ( data < 0x10 ) // RRC
			op |= op << 8;
		op >>= 1;
		if ( data & 0x20 ) // SRA propagates sign bit
			op |= (op << 1) & 0x80;
	shift_comm:
		data &= 7;
		if ( !(op & 0xFF) )
			flags |= z_flag;
		if ( data == 6 )
			goto write_hl_op_ff;
		R8( data ) = op;
		goto loop;

// Load

	case 0x70: // LD (HL),B
	case 0x71: // LD (HL),C
	case 0x72: // LD (HL),D
	case 0x73: // LD (HL),E
	case 0x74: // LD (HL),H
	case 0x75: // LD (HL),L
	case 0x77: // LD (HL),A
		op = R8( op & 7 );
	write_hl_op_ff:
		WRITE( rp.hl, op & 0xFF );
		goto loop;

	case 0x41: case 0x42: case 0x43: case 0x44: case 0x45: case 0x47: // LD r,r
	case 0x48: case 0x4A: case 0x4B: case 0x4C: case 0x4D: case 0x4F:
	case 0x50: case 0x51: case 0x53: case 0x54: case 0x55: case 0x57:
	case 0x58: case 0x59: case 0x5A: case 0x5C: case 0x5D: case 0x5F:
	case 0x60: case 0x61: case 0x62: case 0x63: case 0x65: case 0x67:
	case 0x68: case 0x69: case 0x6A: case 0x6B: case 0x6C: case 0x6F:
	case 0x78: case 0x79: case 0x7A: case 0x7B: case 0x7C: case 0x7D:
		R8( (op >> 3) & 7 ) = R8( op & 7 );
		goto loop;

	case 0x08: // LD IND16,SP
		data = GET_ADDR();
		pc += 2;
		WRITE( data, sp&0xFF );
		data++;
		WRITE( data, sp >> 8 );
		goto loop;
	
	case 0xF9: // LD SP,HL
		sp = rp.hl;
		goto loop;

	case 0x31: // LD SP,IMM
		sp = GET_ADDR();
		pc += 2;
		goto loop;
	
	case 0x01: // LD BC,IMM
	case 0x11: // LD DE,IMM
		r16 [op >> 4] = GET_ADDR();
		pc += 2;
		goto loop;
	
	{
		unsigned temp;
	case 0xE0: // LD (0xFF00+imm),A
		temp = data | 0xFF00;
		pc++;
		goto write_data_rg_a;
	
	case 0xE2: // LD (0xFF00+C),A
		temp = rg.c | 0xFF00;
		goto write_data_rg_a;

	case 0x32: // LD (HL-),A
		temp = rp.hl;
		rp.hl = temp - 1;
		goto write_data_rg_a;
	
	case 0x02: // LD (BC),A
		temp = rp.bc;
		goto write_data_rg_a;
	
	case 0x12: // LD (DE),A
		temp = rp.de;
		goto write_data_rg_a;
	
	case 0x22: // LD (HL+),A
		temp = rp.hl;
		rp.hl = temp + 1;
		goto write_data_rg_a;
		
	case 0xEA: // LD IND16,A (common)
		temp = GET_ADDR();
		pc += 2;
	write_data_rg_a:
		WRITE( temp, rg.a );
		goto loop;
	}
	
	case 0x06: // LD B,IMM
		rg.b = data;
		pc++;
		goto loop;
	
	case 0x0E: // LD C,IMM
		rg.c = data;
		pc++;
		goto loop;
	
	case 0x16: // LD D,IMM
		rg.d = data;
		pc++;
		goto loop;
	
	case 0x1E: // LD E,IMM
		rg.e = data;
		pc++;
		goto loop;
	
	case 0x26: // LD H,IMM
		rg.h = data;
		pc++;
		goto loop;
	
	case 0x2E: // LD L,IMM
		rg.l = data;
		pc++;
		goto loop;
	
	case 0x36: // LD (HL),IMM
		WRITE( rp.hl, data );
		pc++;
		goto loop;
	
	case 0x3E: // LD A,IMM
		rg.a = data;
		pc++;
		goto loop;

// Increment/Decrement

	case 0x03: // INC BC
	case 0x13: // INC DE
	case 0x23: // INC HL
		r16 [op >> 4]++;
		goto loop;
	
	case 0x33: // INC SP
		sp = (sp + 1) & 0xFFFF;
		goto loop;

	case 0x0B: // DEC BC
	case 0x1B: // DEC DE
	case 0x2B: // DEC HL
		r16 [op >> 4]--;
		goto loop;
	
	case 0x3B: // DEC SP
		sp = (sp - 1) & 0xFFFF;
		goto loop;
	
	case 0x34: // INC (HL)
		op = rp.hl;
		data = READ( op );
		data++;
		WRITE( op, data & 0xFF );
		goto inc_comm;
	
	case 0x04: // INC B
	case 0x0C: // INC C (common)
	case 0x14: // INC D
	case 0x1C: // INC E
	case 0x24: // INC H
	case 0x2C: // INC L
	case 0x3C: // INC A
		op = (op >> 3) & 7;
		R8( op ) = data = R8( op ) + 1;
	inc_comm:
		flags = (flags & c_flag) | (((data & 15) - 1) & h_flag) | ((data >> 1) & z_flag);
		goto loop;
	
	case 0x35: // DEC (HL)
		op = rp.hl;
		data = READ( op );
		data--;
		WRITE( op, data & 0xFF );
		goto dec_comm;
	
	case 0x05: // DEC B
	case 0x0D: // DEC C
	case 0x15: // DEC D
	case 0x1D: // DEC E
	case 0x25: // DEC H
	case 0x2D: // DEC L
	case 0x3D: // DEC A
		op = (op >> 3) & 7;
		data = R8( op ) - 1;
		R8( op ) = data;
	dec_comm:
		flags = (flags & c_flag) | n_flag | (((data & 15) + 0x31) & h_flag);
		if ( data & 0xFF )
			goto loop;
		flags |= z_flag;
		goto loop;

// Add 16-bit

	{
		blargg_ulong temp; // need more than 16 bits for carry
		unsigned prev;
		
	case 0xF8: // LD HL,SP+imm
		temp = BOOST::int8_t (data); // sign-extend to 16 bits
		pc++;
		flags = 0;
		temp += sp;
		prev = sp;
		goto add_16_hl;
	
	case 0xE8: // ADD SP,IMM
		temp = BOOST::int8_t (data); // sign-extend to 16 bits
		pc++;
		flags = 0;
		temp += sp;
		prev = sp;
		sp = temp & 0xFFFF;
		goto add_16_comm;

	case 0x39: // ADD HL,SP
		temp = sp;
		goto add_hl_comm;
	
	case 0x09: // ADD HL,BC
	case 0x19: // ADD HL,DE
	case 0x29: // ADD HL,HL
		temp = r16 [op >> 4];
	add_hl_comm:
		prev = rp.hl;
		temp += prev;
		flags &= z_flag;
	add_16_hl:
		rp.hl = (uint16_t)temp;
	add_16_comm:
		flags |= (temp >> 12) & c_flag;
		flags |= (((temp & 0x0FFF) - (prev & 0x0FFF)) >> 7) & h_flag;
		goto loop;
	}
	
	case 0x86: // ADD (HL)
		data = READ( rp.hl );
		goto add_comm;
	
	case 0x80: // ADD B
	case 0x81: // ADD C
	case 0x82: // ADD D
	case 0x83: // ADD E
	case 0x84: // ADD H
	case 0x85: // ADD L
	case 0x87: // ADD A
		data = R8( op & 7 );
		goto add_comm;
	
	case 0xC6: // ADD IMM
		pc++;
	add_comm:
		flags = rg.a;
		data += flags;
		flags = ((data & 15) - (flags & 15)) & h_flag;
		flags |= (data >> 4) & c_flag;
		rg.a = data;
		if ( data & 0xFF )
			goto loop;
		flags |= z_flag;
		goto loop;

// Add/Subtract

	case 0x8E: // ADC (HL)
		data = READ( rp.hl );
		goto adc_comm;
	
	case 0x88: // ADC B
	case 0x89: // ADC C
	case 0x8A: // ADC D
	case 0x8B: // ADC E
	case 0x8C: // ADC H
	case 0x8D: // ADC L
	case 0x8F: // ADC A
		data = R8( op & 7 );
		goto adc_comm;
	
	case 0xCE: // ADC IMM
		pc++;
	adc_comm:
		data += (flags >> 4) & 1;
		data &= 0xFF; // to do: does carry get set when sum + carry = 0x100?
		goto add_comm;

	case 0x96: // SUB (HL)
		data = READ( rp.hl );
		goto sub_comm;
	
	case 0x90: // SUB B
	case 0x91: // SUB C
	case 0x92: // SUB D
	case 0x93: // SUB E
	case 0x94: // SUB H
	case 0x95: // SUB L
	case 0x97: // SUB A
		data = R8( op & 7 );
		goto sub_comm;
	
	case 0xD6: // SUB IMM
		pc++;
	sub_comm:
		op = rg.a;
		data = op - data;
		rg.a = data;
		goto sub_set_flags;

	case 0x9E: // SBC (HL)
		data = READ( rp.hl );
		goto sbc_comm;
	
	case 0x98: // SBC B
	case 0x99: // SBC C
	case 0x9A: // SBC D
	case 0x9B: // SBC E
	case 0x9C: // SBC H
	case 0x9D: // SBC L
	case 0x9F: // SBC A
		data = R8( op & 7 );
		goto sbc_comm;
	
	case 0xDE: // SBC IMM
		pc++;
	sbc_comm:
		data += (flags >> 4) & 1;
		data &= 0xFF; // to do: does carry get set when sum + carry = 0x100?
		goto sub_comm;

// Logical

	case 0xA0: // AND B
	case 0xA1: // AND C
	case 0xA2: // AND D
	case 0xA3: // AND E
	case 0xA4: // AND H
	case 0xA5: // AND L
		data = R8( op & 7 );
		goto and_comm;
	
	case 0xA6: // AND (HL)
		data = READ( rp.hl );
		pc--;
	case 0xE6: // AND IMM
		pc++;
	and_comm:
		rg.a &= data;
	case 0xA7: // AND A
		flags = h_flag | (((rg.a - 1) >> 1) & z_flag);
		goto loop;

	case 0xB0: // OR B
	case 0xB1: // OR C
	case 0xB2: // OR D
	case 0xB3: // OR E
	case 0xB4: // OR H
	case 0xB5: // OR L
		data = R8( op & 7 );
		goto or_comm;
	
	case 0xB6: // OR (HL)
		data = READ( rp.hl );
		pc--;
	case 0xF6: // OR IMM
		pc++;
	or_comm:
		rg.a |= data;
	case 0xB7: // OR A
		flags = ((rg.a - 1) >> 1) & z_flag;
		goto loop;

	case 0xA8: // XOR B
	case 0xA9: // XOR C
	case 0xAA: // XOR D
	case 0xAB: // XOR E
	case 0xAC: // XOR H
	case 0xAD: // XOR L
		data = R8( op & 7 );
		goto xor_comm;
	
	case 0xAE: // XOR (HL)
		data = READ( rp.hl );
		pc--;
	case 0xEE: // XOR IMM
		pc++;
	xor_comm:
		data ^= rg.a;
		rg.a = data;
		data--;
		flags = (data >> 1) & z_flag;
		goto loop;
	
	case 0xAF: // XOR A
		rg.a = 0;
		flags = z_flag;
		goto loop;

// Stack

	case 0xF1: // POP FA
	case 0xC1: // POP BC
	case 0xD1: // POP DE
	case 0xE1: // POP HL (common)
		data = READ( sp );
		r16 [(op >> 4) & 3] = data + 0x100 * READ( sp + 1 );
		sp = (sp + 2) & 0xFFFF;
		if ( op != 0xF1 )
			goto loop;
		flags = rg.flags & 0xF0;
		goto loop;
	
	case 0xC5: // PUSH BC
		data = rp.bc;
		goto push;
	
	case 0xD5: // PUSH DE
		data = rp.de;
		goto push;
	
	case 0xE5: // PUSH HL
		data = rp.hl;
		goto push;
	
	case 0xF5: // PUSH FA
		data = (flags << 8) | rg.a;
		goto push;

// Flow control
	
	case 0xFF:
		if ( pc == idle_addr + 1 )
			goto stop;
	case 0xC7: case 0xCF: case 0xD7: case 0xDF:  // RST
	case 0xE7: case 0xEF: case 0xF7:
		data = pc;
		pc = (op & 0x38) + rst_base;
		goto push;
	
	case 0xCC: // CZ
		pc += 2;
		if ( flags & z_flag )
			goto call;
		goto loop;
	
	case 0xD4: // CNC
		pc += 2;
		if ( !(flags & c_flag) )
			goto call;
		goto loop;
	
	case 0xDC: // CC
		pc += 2;
		if ( flags & c_flag )
			goto call;
		goto loop;

	case 0xD9: // RETI
		//interrupts_enabled = 1;
		goto ret;
	
	case 0xC0: // RZ
		if ( !(flags & z_flag) )
			goto ret;
		goto loop;
	
	case 0xD0: // RNC
		if ( !(flags & c_flag) )
			goto ret;
		goto loop;
	
	case 0xD8: // RC
		if ( flags & c_flag )
			goto ret;
		goto loop;

	case 0x18: // JR
		BRANCH( true )
	
	case 0x30: // JR NC
		BRANCH( !(flags & c_flag) )
	
	case 0x38: // JR C
		BRANCH( flags & c_flag )
	
	case 0xE9: // JP_HL
		pc = rp.hl;
		goto loop;

	case 0xC3: // JP (next-most-common)
		pc = GET_ADDR();
		goto loop;
	
	case 0xC2: // JP NZ
		pc += 2;
		if ( !(flags & z_flag) )
			goto jp_taken;
		goto loop;
	
	case 0xCA: // JP Z (most common)
		pc += 2;
		if ( !(flags & z_flag) )
			goto loop;
	jp_taken:
		pc -= 2;
		pc = GET_ADDR();
		goto loop;
	
	case 0xD2: // JP NC
		pc += 2;
		if ( !(flags & c_flag) )
			goto jp_taken;
		goto loop;
	
	case 0xDA: // JP C
		pc += 2;
		if ( flags & c_flag )
			goto jp_taken;
		goto loop;

// Flags

	case 0x2F: // CPL
		rg.a = ~rg.a;
		flags |= n_flag | h_flag;
		goto loop;

	case 0x3F: // CCF
		flags = (flags ^ c_flag) & ~(n_flag | h_flag);
		goto loop;

	case 0x37: // SCF
		flags = (flags | c_flag) & ~(n_flag | h_flag);
		goto loop;

	case 0xF3: // DI
		//interrupts_enabled = 0;
		goto loop;

	case 0xFB: // EI
		//interrupts_enabled = 1;
		goto loop;

// Special

	case 0xDD: case 0xD3: case 0xDB: case 0xE3: case 0xE4: // ?
	case 0xEB: case 0xEC: case 0xF4: case 0xFD: case 0xFC:
	case 0x10: // STOP
	case 0x27: // DAA (I'll have to implement this eventually...)
	case 0xBF:
	case 0xED: // Z80 prefix
	case 0x76: // HALT
		s.remain++;
		goto stop;
	}
	
	// If this fails then the case above is missing an opcode
	assert( false );
	
stop:
	pc--;
	
	// copy state back
	STATIC_CAST(core_regs_t&,r) = rg;
	r.pc = pc;
	r.sp = sp;
	r.flags = flags;
	
	this->state = &state_;
	memcpy( &this->state_, &s, sizeof this->state_ );
	
	return s.remain > 0;
}